

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTestPackage.cpp
# Opt level: O3

int __thiscall es31cts::ES31TestPackage::init(ES31TestPackage *this,EVP_PKEY_CTX *ctx)

{
  PackageContext *pPVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  TestNode *pTVar3;
  SampleShadingTests *this_00;
  SampleVariablesTests *this_01;
  SeparateShaderObjsTests *this_02;
  ShaderBitfieldOperationTests *this_03;
  ShaderMultisampleInterpolationTests *this_04;
  LayoutBindingTests *this_05;
  ShaderIntegerMixTests *this_06;
  BlendEquationAdvancedTests *this_07;
  GPUShader5Tests *this_08;
  ExtParameters extParams;
  ExtParameters local_28;
  
  deqp::TestPackage::init(&this->super_TestPackage,ctx);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestPackage).super_TestPackage.super_TestNode.m_testCtx,"core",
             "core tests");
  pTVar3 = (TestNode *)operator_new(0x78);
  ::glcts::TextureStorageMultisampleTests::TextureStorageMultisampleTests
            ((TextureStorageMultisampleTests *)pTVar3,
             &((this->super_TestPackage).m_packageCtx)->m_context);
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x78);
  ::glcts::ShaderAtomicCountersTests::ShaderAtomicCountersTests
            ((ShaderAtomicCountersTests *)pTVar3,
             &((this->super_TestPackage).m_packageCtx)->m_context);
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x78);
  ::glcts::TextureGatherTests::TextureGatherTests
            ((TextureGatherTests *)pTVar3,&((this->super_TestPackage).m_packageCtx)->m_context);
  tcu::TestNode::addChild(pTVar2,pTVar3);
  this_00 = (SampleShadingTests *)operator_new(0x80);
  ::glcts::SampleShadingTests::SampleShadingTests
            (this_00,&((this->super_TestPackage).m_packageCtx)->m_context,GLSL_VERSION_310_ES);
  tcu::TestNode::addChild(pTVar2,(TestNode *)this_00);
  this_01 = (SampleVariablesTests *)operator_new(0x80);
  deqp::SampleVariablesTests::SampleVariablesTests
            (this_01,&((this->super_TestPackage).m_packageCtx)->m_context,GLSL_VERSION_310_ES);
  tcu::TestNode::addChild(pTVar2,(TestNode *)this_01);
  this_02 = (SeparateShaderObjsTests *)operator_new(0x80);
  ::glcts::SeparateShaderObjsTests::SeparateShaderObjsTests
            (this_02,&((this->super_TestPackage).m_packageCtx)->m_context,GLSL_VERSION_310_ES);
  tcu::TestNode::addChild(pTVar2,(TestNode *)this_02);
  this_03 = (ShaderBitfieldOperationTests *)operator_new(0x80);
  ::glcts::ShaderBitfieldOperationTests::ShaderBitfieldOperationTests
            (this_03,&((this->super_TestPackage).m_packageCtx)->m_context,GLSL_VERSION_310_ES);
  tcu::TestNode::addChild(pTVar2,(TestNode *)this_03);
  this_04 = (ShaderMultisampleInterpolationTests *)operator_new(0x80);
  deqp::ShaderMultisampleInterpolationTests::ShaderMultisampleInterpolationTests
            (this_04,&((this->super_TestPackage).m_packageCtx)->m_context,GLSL_VERSION_310_ES);
  tcu::TestNode::addChild(pTVar2,(TestNode *)this_04);
  this_05 = (LayoutBindingTests *)operator_new(0x80);
  ::glcts::LayoutBindingTests::LayoutBindingTests
            (this_05,&((this->super_TestPackage).m_packageCtx)->m_context,GLSL_VERSION_310_ES);
  tcu::TestNode::addChild(pTVar2,(TestNode *)this_05);
  this_06 = (ShaderIntegerMixTests *)operator_new(0x80);
  deqp::ShaderIntegerMixTests::ShaderIntegerMixTests
            (this_06,&((this->super_TestPackage).m_packageCtx)->m_context,GLSL_VERSION_310_ES);
  tcu::TestNode::addChild(pTVar2,(TestNode *)this_06);
  this_07 = (BlendEquationAdvancedTests *)operator_new(0x80);
  ::glcts::BlendEquationAdvancedTests::BlendEquationAdvancedTests
            (this_07,&((this->super_TestPackage).m_packageCtx)->m_context,GLSL_VERSION_310_ES);
  tcu::TestNode::addChild(pTVar2,(TestNode *)this_07);
  pTVar3 = (TestNode *)operator_new(0x78);
  ::glcts::VertexAttribBindingTests::VertexAttribBindingTests
            ((VertexAttribBindingTests *)pTVar3,&((this->super_TestPackage).m_packageCtx)->m_context
            );
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x78);
  ::glcts::ShaderStorageBufferObjectTests::ShaderStorageBufferObjectTests
            ((ShaderStorageBufferObjectTests *)pTVar3,
             &((this->super_TestPackage).m_packageCtx)->m_context);
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x78);
  ::glcts::ComputeShaderTests::ComputeShaderTests
            ((ComputeShaderTests *)pTVar3,&((this->super_TestPackage).m_packageCtx)->m_context);
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x78);
  ::glcts::ShaderImageLoadStoreTests::ShaderImageLoadStoreTests
            ((ShaderImageLoadStoreTests *)pTVar3,
             &((this->super_TestPackage).m_packageCtx)->m_context);
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x78);
  ::glcts::ShaderImageSizeTests::ShaderImageSizeTests
            ((ShaderImageSizeTests *)pTVar3,&((this->super_TestPackage).m_packageCtx)->m_context);
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x78);
  ::glcts::DrawIndirectTestsES31::DrawIndirectTestsES31
            ((DrawIndirectTestsES31 *)pTVar3,&((this->super_TestPackage).m_packageCtx)->m_context);
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x78);
  ::glcts::ExplicitUniformLocationES31Tests::ExplicitUniformLocationES31Tests
            ((ExplicitUniformLocationES31Tests *)pTVar3,
             &((this->super_TestPackage).m_packageCtx)->m_context);
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x78);
  ::glcts::ProgramInterfaceQueryTests::ProgramInterfaceQueryTests
            ((ProgramInterfaceQueryTests *)pTVar3,
             &((this->super_TestPackage).m_packageCtx)->m_context);
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x78);
  ::glcts::FramebufferNoAttachmentsTests::FramebufferNoAttachmentsTests
            ((FramebufferNoAttachmentsTests *)pTVar3,
             &((this->super_TestPackage).m_packageCtx)->m_context);
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x78);
  ::glcts::ArrayOfArraysTestGroup::ArrayOfArraysTestGroup
            ((ArrayOfArraysTestGroup *)pTVar3,&((this->super_TestPackage).m_packageCtx)->m_context);
  tcu::TestNode::addChild(pTVar2,pTVar3);
  local_28.glslVersion = GLSL_VERSION_310_ES;
  local_28.extType = EXTENSIONTYPE_OES;
  pTVar3 = (TestNode *)operator_new(0x80);
  ::glcts::GeometryShaderTests::GeometryShaderTests
            ((GeometryShaderTests *)pTVar3,&((this->super_TestPackage).m_packageCtx)->m_context,
             &local_28);
  tcu::TestNode::addChild(pTVar2,pTVar3);
  this_08 = (GPUShader5Tests *)operator_new(0x88);
  ::glcts::GPUShader5Tests::GPUShader5Tests
            (this_08,&((this->super_TestPackage).m_packageCtx)->m_context,&local_28);
  tcu::TestNode::addChild(pTVar2,(TestNode *)this_08);
  pTVar3 = (TestNode *)operator_new(0x80);
  ::glcts::TessellationShaderTests::TessellationShaderTests
            ((TessellationShaderTests *)pTVar3,&((this->super_TestPackage).m_packageCtx)->m_context,
             &local_28);
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x80);
  ::glcts::TextureCubeMapArrayTests::TextureCubeMapArrayTests
            ((TextureCubeMapArrayTests *)pTVar3,&((this->super_TestPackage).m_packageCtx)->m_context
             ,&local_28);
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x80);
  ::glcts::TextureBorderClampTests::TextureBorderClampTests
            ((TextureBorderClampTests *)pTVar3,&((this->super_TestPackage).m_packageCtx)->m_context,
             &local_28);
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x80);
  ::glcts::TextureBufferTests::TextureBufferTests
            ((TextureBufferTests *)pTVar3,&((this->super_TestPackage).m_packageCtx)->m_context,
             &local_28);
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x80);
  ::glcts::DrawBuffersIndexedTests::DrawBuffersIndexedTests
            ((DrawBuffersIndexedTests *)pTVar3,&((this->super_TestPackage).m_packageCtx)->m_context,
             &local_28);
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x80);
  ::glcts::ViewportArrayTests::ViewportArrayTests
            ((ViewportArrayTests *)pTVar3,&((this->super_TestPackage).m_packageCtx)->m_context,
             &local_28);
  tcu::TestNode::addChild(pTVar2,pTVar3);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  pPVar1 = (this->super_TestPackage).m_packageCtx;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,(pPVar1->m_context).m_testCtx,"shaders",
             "Shading Language Tests");
  pTVar2[1]._vptr_TestNode = (_func_int **)pPVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_020ff510;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  return extraout_EAX;
}

Assistant:

void ES31TestPackage::init(void)
{
	// Call init() in parent - this creates context.
	deqp::TestPackage::init();

	try
	{
		tcu::TestCaseGroup* coreGroup = new tcu::TestCaseGroup(getTestContext(), "core", "core tests");

		coreGroup->addChild(new glcts::TextureStorageMultisampleTests(getContext()));
		coreGroup->addChild(new glcts::ShaderAtomicCountersTests(getContext()));
		coreGroup->addChild(new glcts::TextureGatherTests(getContext()));
		coreGroup->addChild(new glcts::SampleShadingTests(getContext(), glu::GLSL_VERSION_310_ES));
		coreGroup->addChild(new deqp::SampleVariablesTests(getContext(), glu::GLSL_VERSION_310_ES));
		coreGroup->addChild(new glcts::SeparateShaderObjsTests(getContext(), glu::GLSL_VERSION_310_ES));
		coreGroup->addChild(new glcts::ShaderBitfieldOperationTests(getContext(), glu::GLSL_VERSION_310_ES));
		coreGroup->addChild(new deqp::ShaderMultisampleInterpolationTests(getContext(), glu::GLSL_VERSION_310_ES));
		coreGroup->addChild(new glcts::LayoutBindingTests(getContext(), glu::GLSL_VERSION_310_ES));
		coreGroup->addChild(new deqp::ShaderIntegerMixTests(getContext(), glu::GLSL_VERSION_310_ES));
		coreGroup->addChild(new glcts::BlendEquationAdvancedTests(getContext(), glu::GLSL_VERSION_310_ES));
		coreGroup->addChild(new glcts::VertexAttribBindingTests(getContext()));
		coreGroup->addChild(new glcts::ShaderStorageBufferObjectTests(getContext()));
		coreGroup->addChild(new glcts::ComputeShaderTests(getContext()));
		coreGroup->addChild(new glcts::ShaderImageLoadStoreTests(getContext()));
		coreGroup->addChild(new glcts::ShaderImageSizeTests(getContext()));
		coreGroup->addChild(new glcts::DrawIndirectTestsES31(getContext()));
		coreGroup->addChild(new glcts::ExplicitUniformLocationES31Tests(getContext()));
		coreGroup->addChild(new glcts::ProgramInterfaceQueryTests(getContext()));
		coreGroup->addChild(new glcts::FramebufferNoAttachmentsTests(getContext()));
		coreGroup->addChild(new glcts::ArrayOfArraysTestGroup(getContext()));

		glcts::ExtParameters extParams(glu::GLSL_VERSION_310_ES, glcts::EXTENSIONTYPE_OES);
		coreGroup->addChild(new glcts::GeometryShaderTests(getContext(), extParams));
		coreGroup->addChild(new glcts::GPUShader5Tests(getContext(), extParams));
		coreGroup->addChild(new glcts::TessellationShaderTests(getContext(), extParams));
		coreGroup->addChild(new glcts::TextureCubeMapArrayTests(getContext(), extParams));
		coreGroup->addChild(new glcts::TextureBorderClampTests(getContext(), extParams));
		coreGroup->addChild(new glcts::TextureBufferTests(getContext(), extParams));
		coreGroup->addChild(new glcts::DrawBuffersIndexedTests(getContext(), extParams));
		coreGroup->addChild(new glcts::ViewportArrayTests(getContext(), extParams));

		addChild(coreGroup);

		addChild(new ShaderTests(getContext()));
	}
	catch (...)
	{
		// Destroy context.
		deqp::TestPackage::deinit();
		throw;
	}
}